

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::csv_reporter::do_measurement_start
          (csv_reporter *this,
          execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *plan)

{
  ostream *poVar1;
  int *in_RSI;
  reporter *in_RDI;
  fp_seconds in_stack_00000158;
  fmtflags in_stack_ffffffffffffff7c;
  ios_base *in_stack_ffffffffffffff80;
  string local_38 [36];
  int local_14;
  
  poVar1 = reporter::report_stream((reporter *)0x1eeeab);
  local_14 = (int)std::setprecision(7);
  std::operator<<(poVar1,(_Setprecision)local_14);
  reporter::report_stream((reporter *)0x1eeed6);
  std::ios_base::unsetf(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (((ulong)in_RDI[1]._vptr_reporter & 0x100000000) != 0) {
    poVar1 = reporter::progress_stream(in_RDI);
    poVar1 = std::operator<<(poVar1,"collecting ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&in_RDI[1]._vptr_reporter);
    poVar1 = std::operator<<(poVar1," samples, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
    poVar1 = std::operator<<(poVar1," iterations each, in estimated ");
    nonius::detail::pretty_duration_abi_cxx11_(in_stack_00000158);
    poVar1 = std::operator<<(poVar1,local_38);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void do_measurement_start(execution_plan<fp_seconds> plan) override {
            report_stream() << std::setprecision(7);
            report_stream().unsetf(std::ios::floatfield);
            if(verbose) progress_stream() << "collecting " << n_samples << " samples, " << plan.iterations_per_sample << " iterations each, in estimated " << detail::pretty_duration(plan.estimated_duration) << "\n";
        }